

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O3

int CVodeQuadSensSStolerances(void *cvode_mem,sunrealtype reltolQS,sunrealtype *abstolQS)

{
  double dVar1;
  long lVar2;
  void *pvVar3;
  int iVar4;
  long lVar5;
  int error_code;
  char *msgfmt;
  int iVar6;
  long lVar7;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar6 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    iVar4 = 0x97c;
  }
  else if (*(int *)((long)cvode_mem + 0x860) == 0) {
    msgfmt = "Forward sensitivity analysis not activated.";
    iVar6 = -0x28;
    error_code = -0x28;
    iVar4 = 0x985;
  }
  else {
    if (*(int *)((long)cvode_mem + 0x86c) == 0) {
      cvProcessError((CVodeMem)cvode_mem,-0x32,0x98e,"CVodeQuadSensSStolerances",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                     ,"Forward sensitivity analysis for quadrature variables not activated.");
      return -0x1e;
    }
    if (0.0 <= reltolQS) {
      if (abstolQS != (sunrealtype *)0x0) {
        iVar4 = *(int *)((long)cvode_mem + 0x90);
        lVar7 = (long)iVar4;
        if (0 < lVar7) {
          lVar2 = 0;
          do {
            if (abstolQS[lVar2] <= 0.0 && abstolQS[lVar2] != 0.0) {
              msgfmt = "abstolQS has negative component(s) (illegal).";
              iVar6 = -0x16;
              error_code = -0x16;
              iVar4 = 0x9a7;
              goto LAB_00116672;
            }
            lVar2 = lVar2 + 1;
          } while (lVar7 != lVar2);
        }
        *(undefined4 *)((long)cvode_mem + 0x128) = 1;
        *(sunrealtype *)((long)cvode_mem + 0x130) = reltolQS;
        if (*(int *)((long)cvode_mem + 0x868) == 0) {
          pvVar3 = malloc(lVar7 * 8);
          *(void **)((long)cvode_mem + 0x138) = pvVar3;
          pvVar3 = malloc(lVar7 * 4);
          *(void **)((long)cvode_mem + 0x148) = pvVar3;
          *(long *)((long)cvode_mem + 0x718) = *(long *)((long)cvode_mem + 0x718) + lVar7;
          *(undefined4 *)((long)cvode_mem + 0x868) = 1;
        }
        if (0 < iVar4) {
          lVar7 = *(long *)((long)cvode_mem + 0x138);
          lVar2 = *(long *)((long)cvode_mem + 0x148);
          lVar5 = 0;
          do {
            dVar1 = abstolQS[lVar5];
            *(double *)(lVar7 + lVar5 * 8) = dVar1;
            *(uint *)(lVar2 + lVar5 * 4) = -(uint)(dVar1 == 0.0) & 1;
            lVar5 = lVar5 + 1;
          } while (lVar5 < *(int *)((long)cvode_mem + 0x90));
          return 0;
        }
        return 0;
      }
      msgfmt = "abstolQS = NULL illegal.";
      iVar6 = -0x16;
      error_code = -0x16;
      iVar4 = 0x99e;
    }
    else {
      msgfmt = "reltolQS < 0 illegal.";
      iVar6 = -0x16;
      error_code = -0x16;
      iVar4 = 0x997;
    }
  }
LAB_00116672:
  cvProcessError((CVodeMem)cvode_mem,error_code,iVar4,"CVodeQuadSensSStolerances",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                 ,msgfmt);
  return iVar6;
}

Assistant:

int CVodeQuadSensSStolerances(void* cvode_mem, sunrealtype reltolQS,
                              sunrealtype* abstolQS)
{
  CVodeMem cv_mem;
  int is;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Check if sensitivity was initialized */

  if (cv_mem->cv_SensMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_SENS, __LINE__, __func__, __FILE__,
                   MSGCV_NO_SENSI);
    return (CV_NO_SENS);
  }

  /* Ckeck if quadrature sensitivity was initialized? */

  if (cv_mem->cv_QuadSensMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_QUADSENS, __LINE__, __func__, __FILE__,
                   MSGCV_NO_QUADSENSI);
    return (CV_NO_QUAD);
  }

  /* Test user-supplied tolerances */

  if (reltolQS < ZERO)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_RELTOLQS);
    return (CV_ILL_INPUT);
  }

  if (abstolQS == NULL)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_NULL_ABSTOLQS);
    return (CV_ILL_INPUT);
  }

  for (is = 0; is < cv_mem->cv_Ns; is++)
  {
    if (abstolQS[is] < ZERO)
    {
      cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                     MSGCV_BAD_ABSTOLQS);
      return (CV_ILL_INPUT);
    }
  }

  /* Copy tolerances into memory */

  cv_mem->cv_itolQS = CV_SS;

  cv_mem->cv_reltolQS = reltolQS;

  if (!(cv_mem->cv_SabstolQSMallocDone))
  {
    cv_mem->cv_SabstolQS = NULL;
    cv_mem->cv_SabstolQS =
      (sunrealtype*)malloc(cv_mem->cv_Ns * sizeof(sunrealtype));
    cv_mem->cv_atolQSmin0 =
      (sunbooleantype*)malloc(cv_mem->cv_Ns * sizeof(sunbooleantype));
    cv_mem->cv_lrw += cv_mem->cv_Ns;
    cv_mem->cv_SabstolQSMallocDone = SUNTRUE;
  }

  for (is = 0; is < cv_mem->cv_Ns; is++)
  {
    cv_mem->cv_SabstolQS[is]  = abstolQS[is];
    cv_mem->cv_atolQSmin0[is] = (abstolQS[is] == ZERO);
  }

  return (CV_SUCCESS);
}